

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qminimalbackingstore.cpp
# Opt level: O1

void __thiscall
QMinimalBackingStore::QMinimalBackingStore(QMinimalBackingStore *this,QWindow *window)

{
  QTextStream *this_00;
  uint uVar1;
  QMinimalIntegration *pQVar2;
  long in_FS_OFFSET;
  QByteArrayView QVar3;
  QTextStream *local_40;
  QString local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  QPlatformBackingStore::QPlatformBackingStore(&this->super_QPlatformBackingStore,window);
  *(undefined ***)this = &PTR__QMinimalBackingStore_001087f0;
  QImage::QImage(&this->mImage);
  pQVar2 = QMinimalIntegration::instance();
  uVar1 = pQVar2->m_options & 1;
  this->mDebug = SUB41(uVar1,0);
  if (uVar1 != 0) {
    QMessageLogger::debug();
    this_00 = local_40;
    QVar3.m_data = (storage_type *)0x2b;
    QVar3.m_size = (qsizetype)&local_38;
    QString::fromUtf8(QVar3);
    QTextStream::operator<<(this_00,&local_38);
    if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (local_40[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(local_40,' ');
    }
    QTextStream::operator<<(local_40,(ulonglong)this);
    if (local_40[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(local_40,' ');
    }
    QDebug::~QDebug((QDebug *)&local_40);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QMinimalBackingStore::QMinimalBackingStore(QWindow *window)
    : QPlatformBackingStore(window)
    , mDebug(QMinimalIntegration::instance()->options() & QMinimalIntegration::DebugBackingStore)
{
    if (mDebug)
        qDebug() << "QMinimalBackingStore::QMinimalBackingStore:" << (quintptr)this;
}